

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbg.cc
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  size_t sVar5;
  int iVar6;
  string *this;
  pointer data;
  vector<double,_std::allocator<double>_> *sequence_to_write;
  size_type __n;
  char *pcVar7;
  int num_order;
  int num_iteration;
  int min_num_vector_in_cluster;
  int target_codebook_size;
  int seed;
  StatisticsAccumulation statistics_accumulation;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  input_vectors;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  codebook_vectors;
  double splitting_factor;
  double convergence_threshold;
  vector<int,_std::allocator<int>_> codebook_indices;
  ostringstream error_message_10;
  double total_distance;
  ifstream ifs;
  vector<double,_std::allocator<double>_> tmp_1;
  LindeBuzoGrayAlgorithm codebook_design;
  int local_714;
  int local_710;
  int local_70c;
  int local_708;
  int local_704;
  undefined1 local_700 [32];
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_6c8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_6a8;
  double local_688;
  double local_680;
  vector<double,_std::allocator<double>_> local_678;
  string local_660;
  byte abStack_640 [80];
  ios_base local_5f0 [408];
  double local_458;
  string local_450;
  byte abStack_430 [80];
  ios_base local_3e0 [408];
  undefined1 local_248 [376];
  LindeBuzoGrayAlgorithm local_d0;
  
  local_714 = 0x19;
  local_704 = 1;
  local_708 = 0x100;
  local_70c = 1;
  local_710 = 1000;
  local_680 = 1e-05;
  local_688 = 1e-05;
  local_6e0 = (char *)0x0;
  local_6d8 = (char *)0x0;
  local_6d0 = (char *)0x0;
LAB_001038e0:
  while (iVar4 = ya_getopt_long(argc,argv,"l:m:s:e:C:I:S:n:i:d:r:h",(option *)0x0,(int *)0x0),
        iVar4 < 0x53) {
    if (iVar4 == 0x43) {
      local_6d0 = ya_optarg;
    }
    else {
      if (iVar4 != 0x49) {
        if (iVar4 != -1) goto switchD_0010390f_caseD_66;
        if (argc - ya_optind < 2) {
          if (argc == ya_optind) {
            pcVar7 = (char *)0x0;
          }
          else {
            pcVar7 = argv[ya_optind];
          }
          bVar2 = sptk::SetBinaryMode();
          this = &local_450;
          if (bVar2) {
            std::ifstream::ifstream(this);
            if ((pcVar7 == (char *)0x0) ||
               (std::ifstream::open((char *)&local_450,(_Ios_Openmode)pcVar7),
               (abStack_430[*(long *)(local_450._M_dataplus._M_p + -0x18)] & 5) == 0)) {
              cVar3 = std::__basic_file<char>::is_open();
              if (cVar3 == '\0') {
                this = (string *)&std::cin;
              }
              __n = (long)local_714 + 1;
              local_6c8.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start =
                   (vector<double,_std::allocator<double>_> *)0x0;
              local_6c8.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish =
                   (vector<double,_std::allocator<double>_> *)0x0;
              local_6c8.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::vector<double,_std::allocator<double>_>::vector
                        ((vector<double,_std::allocator<double>_> *)&local_660,__n,
                         (allocator_type *)local_248);
              while( true ) {
                iVar4 = (int)__n;
                bVar2 = sptk::ReadStream<double>
                                  (false,0,0,iVar4,
                                   (vector<double,_std::allocator<double>_> *)&local_660,
                                   (istream *)this,(int *)0x0);
                if (!bVar2) break;
                std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::push_back(&local_6c8,(value_type *)&local_660);
              }
              if (local_660._M_dataplus._M_p != (pointer)0x0) {
                operator_delete(local_660._M_dataplus._M_p);
              }
              if (local_6c8.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start ==
                  local_6c8.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                iVar6 = 0;
              }
              else {
                local_6a8.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start =
                     (vector<double,_std::allocator<double>_> *)0x0;
                local_6a8.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish =
                     (vector<double,_std::allocator<double>_> *)0x0;
                local_6a8.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                if (local_6d0 == (char *)0x0) {
                  sptk::StatisticsAccumulation::StatisticsAccumulation
                            ((StatisticsAccumulation *)local_700,local_714,1,false,false);
                  sptk::StatisticsAccumulation::Buffer::Buffer((Buffer *)local_248);
                  if (local_6c8.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start !=
                      local_6c8.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
                    data = local_6c8.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                    do {
                      bVar2 = sptk::StatisticsAccumulation::Run
                                        ((StatisticsAccumulation *)local_700,data,
                                         (Buffer *)local_248);
                      if (!bVar2) {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_660);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_660,"Failed to initialize codebook",0x1d);
                        local_d0._vptr_LindeBuzoGrayAlgorithm =
                             (_func_int **)&local_d0.target_codebook_size_;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_d0,"lbg","");
                        sptk::PrintErrorMessage((string *)&local_d0,(ostringstream *)&local_660);
                        if (local_d0._vptr_LindeBuzoGrayAlgorithm !=
                            (_func_int **)&local_d0.target_codebook_size_) {
                          operator_delete(local_d0._vptr_LindeBuzoGrayAlgorithm);
                        }
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_660);
                        std::ios_base::~ios_base(local_5f0);
                        sptk::StatisticsAccumulation::Buffer::~Buffer((Buffer *)local_248);
                        goto LAB_001048bf;
                      }
                      data = data + 1;
                    } while (data != local_6c8.
                                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish);
                  }
                  std::vector<double,_std::allocator<double>_>::vector
                            (&local_678,__n,(allocator_type *)&local_660);
                  bVar2 = sptk::StatisticsAccumulation::GetMean
                                    ((StatisticsAccumulation *)local_700,(Buffer *)local_248,
                                     &local_678);
                  if (bVar2) {
                    iVar6 = 0;
                    std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::push_back(&local_6a8,&local_678);
                  }
                  else {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_660);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_660,"Failed to initialize codebook",0x1d);
                    local_d0._vptr_LindeBuzoGrayAlgorithm =
                         (_func_int **)&local_d0.target_codebook_size_;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"lbg","");
                    sptk::PrintErrorMessage((string *)&local_d0,(ostringstream *)&local_660);
                    if (local_d0._vptr_LindeBuzoGrayAlgorithm !=
                        (_func_int **)&local_d0.target_codebook_size_) {
                      operator_delete(local_d0._vptr_LindeBuzoGrayAlgorithm);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_660);
                    std::ios_base::~ios_base(local_5f0);
                    iVar6 = 1;
                  }
                  if (local_678.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_678.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  sptk::StatisticsAccumulation::Buffer::~Buffer((Buffer *)local_248);
                  if (bVar2) goto LAB_001045b6;
                }
                else {
                  std::ifstream::ifstream(&local_660);
                  std::ifstream::open((char *)&local_660,(_Ios_Openmode)local_6d0);
                  if ((abStack_640[*(long *)(local_660._M_dataplus._M_p + -0x18)] & 5) == 0) {
                    std::vector<double,_std::allocator<double>_>::vector
                              ((vector<double,_std::allocator<double>_> *)local_248,__n,
                               (allocator_type *)&local_d0);
                    while (bVar2 = sptk::ReadStream<double>
                                             (false,0,0,iVar4,
                                              (vector<double,_std::allocator<double>_> *)local_248,
                                              (istream *)&local_660,(int *)0x0), bVar2) {
                      std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::push_back(&local_6a8,(vector<double,_std::allocator<double>_> *)local_248);
                    }
                    if ((pointer)local_248._0_8_ != (pointer)0x0) {
                      operator_delete((void *)local_248._0_8_);
                    }
                    std::ifstream::~ifstream(&local_660);
LAB_001045b6:
                    sptk::LindeBuzoGrayAlgorithm::LindeBuzoGrayAlgorithm
                              (&local_d0,local_714,
                               (int)((ulong)((long)local_6a8.
                                                                                                      
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)local_6a8.
                                                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                               -0x55555555,local_708,local_70c,local_710,local_680,local_688,
                               local_704);
                    if (local_d0.is_valid_ != false) {
                      std::vector<int,_std::allocator<int>_>::vector
                                ((vector<int,_std::allocator<int>_> *)&local_678,
                                 ((long)local_6c8.
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_6c8.
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                 -0x5555555555555555,(allocator_type *)&local_660);
                      bVar2 = sptk::LindeBuzoGrayAlgorithm::Run
                                        (&local_d0,&local_6c8,&local_6a8,
                                         (vector<int,_std::allocator<int>_> *)&local_678,&local_458)
                      ;
                      if (bVar2) {
                        sequence_to_write =
                             local_6a8.
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start;
                        if (local_6a8.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start !=
                            local_6a8.
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish) {
                          do {
                            bVar2 = sptk::WriteStream<double>
                                              (0,iVar4,sequence_to_write,(ostream *)&std::cout,
                                               (int *)0x0);
                            if (!bVar2) {
                              std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)&local_660);
                              std::__ostream_insert<char,std::char_traits<char>>
                                        ((ostream *)&local_660,"Failed to write codebook vector",
                                         0x1f);
                              local_248._0_8_ = local_248 + 0x10;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_248,"lbg","");
                              sptk::PrintErrorMessage
                                        ((string *)local_248,(ostringstream *)&local_660);
                              goto LAB_001049b3;
                            }
                            sequence_to_write = sequence_to_write + 1;
                          } while (sequence_to_write !=
                                   local_6a8.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish);
                        }
                        if (local_6d8 != (char *)0x0) {
                          std::ofstream::ofstream(&local_660);
                          std::ofstream::open((char *)&local_660,(_Ios_Openmode)local_6d8);
                          if ((abStack_640[*(long *)(local_660._M_dataplus._M_p + -0x18)] & 5) == 0)
                          {
                            bVar2 = sptk::WriteStream<int>
                                              (0,(int)((ulong)((long)local_678.
                                                                                                                                          
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_678.
                                                                                                                
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 2),
                                               (vector<int,_std::allocator<int>_> *)&local_678,
                                               (ostream *)&local_660,(int *)0x0);
                            if (bVar2) {
                              std::ofstream::~ofstream(&local_660);
                              goto LAB_00104a25;
                            }
                            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_248,"Failed to write codebook index",0x1e);
                            local_700._0_8_ = local_700 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_700,"lbg","");
                            sptk::PrintErrorMessage((string *)local_700,(ostringstream *)local_248);
                          }
                          else {
                            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_248,"Cannot open file ",0x11);
                            pcVar7 = local_6d8;
                            sVar5 = strlen(local_6d8);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_248,pcVar7,sVar5);
                            local_700._0_8_ = local_700 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_700,"lbg","");
                            sptk::PrintErrorMessage((string *)local_700,(ostringstream *)local_248);
                          }
LAB_00104bd2:
                          if ((undefined1 *)local_700._0_8_ != local_700 + 0x10) {
                            operator_delete((void *)local_700._0_8_);
                          }
                          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
                          std::ios_base::~ios_base((ios_base *)(local_248 + 0x70));
                          std::ofstream::~ofstream(&local_660);
                          goto LAB_00104c0f;
                        }
LAB_00104a25:
                        iVar6 = 0;
                        if (local_6e0 != (char *)0x0) {
                          std::ofstream::ofstream(&local_660);
                          std::ofstream::open((char *)&local_660,(_Ios_Openmode)local_6e0);
                          if ((abStack_640[*(long *)(local_660._M_dataplus._M_p + -0x18)] & 5) == 0)
                          {
                            bVar2 = sptk::WriteStream<double>(local_458,(ostream *)&local_660);
                            if (bVar2) {
                              std::ofstream::~ofstream(&local_660);
                              goto LAB_00104c14;
                            }
                            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_248,"Failed to write total distance",0x1e);
                            local_700._0_8_ = local_700 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_700,"lbg","");
                            sptk::PrintErrorMessage((string *)local_700,(ostringstream *)local_248);
                          }
                          else {
                            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_248,"Cannot open file ",0x11);
                            pcVar7 = local_6e0;
                            sVar5 = strlen(local_6e0);
                            std::__ostream_insert<char,std::char_traits<char>>
                                      ((ostream *)local_248,pcVar7,sVar5);
                            local_700._0_8_ = local_700 + 0x10;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_700,"lbg","");
                            sptk::PrintErrorMessage((string *)local_700,(ostringstream *)local_248);
                          }
                          goto LAB_00104bd2;
                        }
                      }
                      else {
                        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_660);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_660,"Failed to design codebook",0x19);
                        local_248._0_8_ = local_248 + 0x10;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_248,"lbg","");
                        sptk::PrintErrorMessage((string *)local_248,(ostringstream *)&local_660);
LAB_001049b3:
                        if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
                          operator_delete((void *)local_248._0_8_);
                        }
                        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_660);
                        std::ios_base::~ios_base(local_5f0);
LAB_00104c0f:
                        iVar6 = 1;
                      }
LAB_00104c14:
                      if (local_678.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start != (pointer)0x0) {
                        operator_delete(local_678.
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                      }
                      goto LAB_001048c4;
                    }
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_660);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_660,"Failed to initialize LindeBuzoGrayAlgorithm",
                               0x2b);
                    local_248._0_8_ = local_248 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"lbg","");
                    sptk::PrintErrorMessage((string *)local_248,(ostringstream *)&local_660);
                    if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
                      operator_delete((void *)local_248._0_8_);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_660);
                    std::ios_base::~ios_base(local_5f0);
                  }
                  else {
                    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_248);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_248,"Cannot open file ",0x11);
                    pcVar7 = local_6d0;
                    sVar5 = strlen(local_6d0);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_248,pcVar7,sVar5);
                    local_d0._vptr_LindeBuzoGrayAlgorithm =
                         (_func_int **)&local_d0.target_codebook_size_;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"lbg","");
                    sptk::PrintErrorMessage((string *)&local_d0,(ostringstream *)local_248);
                    if (local_d0._vptr_LindeBuzoGrayAlgorithm !=
                        (_func_int **)&local_d0.target_codebook_size_) {
                      operator_delete(local_d0._vptr_LindeBuzoGrayAlgorithm);
                    }
                    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_248);
                    std::ios_base::~ios_base((ios_base *)(local_248 + 0x70));
                    std::ifstream::~ifstream(&local_660);
                  }
LAB_001048bf:
                  iVar6 = 1;
                }
LAB_001048c4:
                std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::~vector(&local_6a8);
              }
              std::
              vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ::~vector(&local_6c8);
            }
            else {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_660);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_660,"Cannot open file ",0x11);
              sVar5 = strlen(pcVar7);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_660,pcVar7,sVar5)
              ;
              local_248._0_8_ = local_248 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"lbg","");
              sptk::PrintErrorMessage((string *)local_248,(ostringstream *)&local_660);
              if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
                operator_delete((void *)local_248._0_8_);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_660);
              std::ios_base::~ios_base(local_5f0);
              iVar6 = 1;
            }
            std::ifstream::~ifstream(&local_450);
            return iVar6;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this,"Cannot set translation mode",0x1b);
          local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"lbg","");
          sptk::PrintErrorMessage(&local_660,(ostringstream *)&local_450);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_450,"Too many input files",0x14);
          local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"lbg","");
          sptk::PrintErrorMessage(&local_660,(ostringstream *)&local_450);
        }
        goto LAB_00104198;
      }
      local_6d8 = ya_optarg;
    }
  }
  switch(iVar4) {
  case 100:
    std::__cxx11::string::string((string *)&local_450,ya_optarg,(allocator *)&local_660);
    bVar1 = sptk::ConvertStringToDouble(&local_450,&local_680);
    bVar2 = local_680 < 0.0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
    if (!bVar1 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_450,
                 "The argument for the -d option must be a non-negative number",0x3c);
      local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"lbg","");
      sptk::PrintErrorMessage(&local_660,(ostringstream *)&local_450);
      goto LAB_00104198;
    }
    goto LAB_001038e0;
  case 0x65:
    std::__cxx11::string::string((string *)&local_450,ya_optarg,(allocator *)&local_660);
    bVar1 = sptk::ConvertStringToInteger(&local_450,&local_708);
    bVar2 = local_708 < 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
    if (!bVar1 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_450,"The argument for the -e option must be greater than 1",0x35)
      ;
      local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"lbg","");
      sptk::PrintErrorMessage(&local_660,(ostringstream *)&local_450);
      goto LAB_00104198;
    }
    goto LAB_001038e0;
  case 0x66:
  case 0x67:
  case 0x6a:
  case 0x6b:
  case 0x6f:
  case 0x70:
  case 0x71:
    goto switchD_0010390f_caseD_66;
  case 0x68:
    anon_unknown.dwarf_4865::PrintUsage((ostream *)&std::cout);
    return 0;
  case 0x69:
    std::__cxx11::string::string((string *)&local_450,ya_optarg,(allocator *)&local_660);
    bVar1 = sptk::ConvertStringToInteger(&local_450,&local_710);
    bVar2 = local_710 < 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
    if (!bVar1 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_450,"The argument for the -i option must be a positive integer",
                 0x39);
      local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"lbg","");
      sptk::PrintErrorMessage(&local_660,(ostringstream *)&local_450);
      goto LAB_00104198;
    }
    goto LAB_001038e0;
  case 0x6c:
    std::__cxx11::string::string((string *)&local_450,ya_optarg,(allocator *)&local_660);
    bVar1 = sptk::ConvertStringToInteger(&local_450,&local_714);
    bVar2 = local_714 < 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
    if (!bVar1 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_450,"The argument for the -l option must be a positive integer",
                 0x39);
      local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"lbg","");
      sptk::PrintErrorMessage(&local_660,(ostringstream *)&local_450);
      goto LAB_00104198;
    }
    local_714 = local_714 + -1;
    goto LAB_001038e0;
  case 0x6d:
    std::__cxx11::string::string((string *)&local_450,ya_optarg,(allocator *)&local_660);
    bVar2 = sptk::ConvertStringToInteger(&local_450,&local_714);
    bVar1 = local_714 < 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
    if (!bVar2 || bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_450,"The argument for the -m option must be a ",0x29);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_450,"non-negative integer",0x14);
      local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"lbg","");
      sptk::PrintErrorMessage(&local_660,(ostringstream *)&local_450);
      goto LAB_00104198;
    }
    goto LAB_001038e0;
  case 0x6e:
    std::__cxx11::string::string((string *)&local_450,ya_optarg,(allocator *)&local_660);
    bVar1 = sptk::ConvertStringToInteger(&local_450,&local_70c);
    bVar2 = local_70c < 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
    if (!bVar1 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_450,"The argument for the -n option must be a positive integer",
                 0x39);
      local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"lbg","");
      sptk::PrintErrorMessage(&local_660,(ostringstream *)&local_450);
      goto LAB_00104198;
    }
    goto LAB_001038e0;
  case 0x72:
    std::__cxx11::string::string((string *)&local_450,ya_optarg,(allocator *)&local_660);
    bVar1 = sptk::ConvertStringToDouble(&local_450,&local_688);
    bVar2 = local_688 <= 0.0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_450._M_dataplus._M_p != &local_450.field_2) {
      operator_delete(local_450._M_dataplus._M_p);
    }
    if (!bVar1 || bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_450,"The argument for the -r option must be a positive number",
                 0x38);
      local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"lbg","");
      sptk::PrintErrorMessage(&local_660,(ostringstream *)&local_450);
      goto LAB_00104198;
    }
    goto LAB_001038e0;
  case 0x73:
    break;
  default:
    if (iVar4 == 0x53) {
      local_6e0 = ya_optarg;
      goto LAB_001038e0;
    }
switchD_0010390f_caseD_66:
    anon_unknown.dwarf_4865::PrintUsage((ostream *)&std::cerr);
    return 1;
  }
  std::__cxx11::string::string((string *)&local_450,ya_optarg,(allocator *)&local_660);
  bVar2 = sptk::ConvertStringToInteger(&local_450,&local_704);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p);
  }
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_450);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_450,"The argument for the -s option must be an integer",0x31);
    local_660._M_dataplus._M_p = (pointer)&local_660.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_660,"lbg","");
    sptk::PrintErrorMessage(&local_660,(ostringstream *)&local_450);
LAB_00104198:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_660._M_dataplus._M_p != &local_660.field_2) {
      operator_delete(local_660._M_dataplus._M_p);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_450);
    std::ios_base::~ios_base(local_3e0);
    return 1;
  }
  goto LAB_001038e0;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  int seed(kDefaultSeed);
  int target_codebook_size(kDefaultTargetCodebookSize);
  const char* initial_codebook_file(NULL);
  const char* codebook_index_file(NULL);
  const char* total_distance_file(NULL);
  int min_num_vector_in_cluster(kDefaultMinNumVectorInCluster);
  int num_iteration(kDefaultNumIteration);
  double convergence_threshold(kDefaultConvergenceThreshold);
  double splitting_factor(kDefaultSplittingFactor);

  for (;;) {
    const int option_char(
        getopt_long(argc, argv, "l:m:s:e:C:I:S:n:i:d:r:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        --num_order;
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 's': {
        if (!sptk::ConvertStringToInteger(optarg, &seed)) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be an integer";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 'e': {
        if (!sptk::ConvertStringToInteger(optarg, &target_codebook_size) ||
            target_codebook_size <= 1) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -e option must be greater than 1";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 'C': {
        initial_codebook_file = optarg;
        break;
      }
      case 'I': {
        codebook_index_file = optarg;
        break;
      }
      case 'S': {
        total_distance_file = optarg;
        break;
      }
      case 'n': {
        if (!sptk::ConvertStringToInteger(optarg, &min_num_vector_in_cluster) ||
            min_num_vector_in_cluster <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -n option must be a positive integer";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 'i': {
        if (!sptk::ConvertStringToInteger(optarg, &num_iteration) ||
            num_iteration <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -i option must be a positive integer";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 'd': {
        if (!sptk::ConvertStringToDouble(optarg, &convergence_threshold) ||
            convergence_threshold < 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -d option must be a non-negative number";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 'r': {
        if (!sptk::ConvertStringToDouble(optarg, &splitting_factor) ||
            splitting_factor <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -r option must be a positive number";
          sptk::PrintErrorMessage("lbg", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("lbg", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("lbg", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  const int length(num_order + 1);
  std::vector<std::vector<double> > input_vectors;
  {
    std::vector<double> tmp(length);
    while (sptk::ReadStream(false, 0, 0, length, &tmp, &input_stream, NULL)) {
      input_vectors.push_back(tmp);
    }
  }
  if (input_vectors.empty()) return 0;

  std::vector<std::vector<double> > codebook_vectors;
  if (NULL == initial_codebook_file) {
    sptk::StatisticsAccumulation statistics_accumulation(num_order, 1);
    sptk::StatisticsAccumulation::Buffer buffer;
    for (std::vector<std::vector<double> >::iterator itr(input_vectors.begin());
         itr != input_vectors.end(); ++itr) {
      if (!statistics_accumulation.Run(*itr, &buffer)) {
        std::ostringstream error_message;
        error_message << "Failed to initialize codebook";
        sptk::PrintErrorMessage("lbg", error_message);
        return 1;
      }
    }

    std::vector<double> mean(length);
    if (!statistics_accumulation.GetMean(buffer, &mean)) {
      std::ostringstream error_message;
      error_message << "Failed to initialize codebook";
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
    codebook_vectors.push_back(mean);
  } else {
    std::ifstream ifs2;
    ifs2.open(initial_codebook_file, std::ios::in | std::ios::binary);
    if (ifs2.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << initial_codebook_file;
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }

    std::vector<double> tmp(length);
    while (sptk::ReadStream(false, 0, 0, length, &tmp, &ifs2, NULL)) {
      codebook_vectors.push_back(tmp);
    }
  }

  sptk::LindeBuzoGrayAlgorithm codebook_design(
      num_order, static_cast<int>(codebook_vectors.size()),
      target_codebook_size, min_num_vector_in_cluster, num_iteration,
      convergence_threshold, splitting_factor, seed);
  if (!codebook_design.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize LindeBuzoGrayAlgorithm";
    sptk::PrintErrorMessage("lbg", error_message);
    return 1;
  }

  double total_distance;
  std::vector<int> codebook_indices(input_vectors.size());
  if (!codebook_design.Run(input_vectors, &codebook_vectors, &codebook_indices,
                           &total_distance)) {
    std::ostringstream error_message;
    error_message << "Failed to design codebook";
    sptk::PrintErrorMessage("lbg", error_message);
    return 1;
  }

  for (std::vector<std::vector<double> >::iterator itr(
           codebook_vectors.begin());
       itr != codebook_vectors.end(); ++itr) {
    if (!sptk::WriteStream(0, length, *itr, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write codebook vector";
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
  }

  if (NULL != codebook_index_file) {
    std::ofstream ofs;
    ofs.open(codebook_index_file, std::ios::out | std::ios::binary);
    if (ofs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << codebook_index_file;
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
    std::ostream& output_stream(ofs);

    if (!sptk::WriteStream(0, static_cast<int>(codebook_indices.size()),
                           codebook_indices, &output_stream, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write codebook index";
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
  }

  if (NULL != total_distance_file) {
    std::ofstream ofs;
    ofs.open(total_distance_file, std::ios::out | std::ios::binary);
    if (ofs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << total_distance_file;
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
    std::ostream& output_stream(ofs);

    if (!sptk::WriteStream(total_distance, &output_stream)) {
      std::ostringstream error_message;
      error_message << "Failed to write total distance";
      sptk::PrintErrorMessage("lbg", error_message);
      return 1;
    }
  }

  return 0;
}